

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void __thiscall CharConvByte::putch(CharConvByte *this,char **buf,wchar_t ch,int idx,int pct)

{
  char *pcVar1;
  
  if (pct != 0 || ch < L'Ā') {
    pcVar1 = *buf;
    *buf = pcVar1 + 1;
    *pcVar1 = (char)ch;
    return;
  }
  err_throw(0x7e7);
}

Assistant:

virtual void putch(char *&buf, wchar_t ch, int idx, int pct)
    {
        /* raw bytes - make sure the byte is in range */
        if (ch > 255)
        {
            /* % modifier -> truncate to byte, otherwise it's an error */
            if (pct)
                ch &= 0xff;
            else
                err_throw(VMERR_NUM_OVERFLOW);
        }

        /* store it */
        *buf++ = (char)ch;
    }